

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

uint __thiscall
TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Reserve
          (TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry> *this,uint amount)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint i;
  uint uVar4;
  long lVar5;
  long lVar6;
  PoolEntry *pPVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  Grow(this,amount);
  uVar1 = this->Count;
  uVar4 = uVar1 + amount;
  this->Count = uVar4;
  auVar3 = _DAT_0073b300;
  auVar2 = _DAT_0073b2f0;
  if (uVar1 < uVar4) {
    lVar5 = (ulong)uVar4 - (ulong)uVar1;
    lVar6 = lVar5 + -1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    pPVar7 = this->Array + uVar1;
    uVar8 = 0;
    auVar9 = auVar9 ^ _DAT_0073b300;
    do {
      auVar10._8_4_ = (int)uVar8;
      auVar10._0_8_ = uVar8;
      auVar10._12_4_ = (int)(uVar8 >> 0x20);
      auVar10 = (auVar10 | auVar2) ^ auVar3;
      if ((bool)(~(auVar10._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar10._0_4_ ||
                  auVar9._4_4_ < auVar10._4_4_) & 1)) {
        (pPVar7->Str).Chars = (char *)0x8a502c;
      }
      if ((auVar10._12_4_ != auVar9._12_4_ || auVar10._8_4_ <= auVar9._8_4_) &&
          auVar10._12_4_ <= auVar9._12_4_) {
        pPVar7[1].Str.Chars = (char *)0x8a502c;
      }
      uVar8 = uVar8 + 2;
      pPVar7 = pPVar7 + 2;
    } while ((lVar5 + 1U & 0xfffffffffffffffe) != uVar8);
    FString::NullString.RefCount = FString::NullString.RefCount + amount;
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}